

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O0

void helper_psignd_mmx_x86_64(CPUX86State *env,MMXReg *d,MMXReg *s)

{
  uint32_t local_30;
  uint32_t local_2c;
  uint32_t local_28;
  uint32_t local_24;
  MMXReg *s_local;
  MMXReg *d_local;
  CPUX86State *env_local;
  
  if (s->_l_MMXReg[0] < 0x80000000) {
    if (s->_l_MMXReg[0] == 0) {
      local_24 = 0;
    }
    else {
      local_24 = d->_l_MMXReg[0];
    }
    local_28 = local_24;
  }
  else {
    local_28 = -d->_l_MMXReg[0];
  }
  d->_l_MMXReg[0] = local_28;
  if (s->_l_MMXReg[1] < 0x80000000) {
    if (s->_l_MMXReg[1] == 0) {
      local_2c = 0;
    }
    else {
      local_2c = d->_l_MMXReg[1];
    }
    local_30 = local_2c;
  }
  else {
    local_30 = -d->_l_MMXReg[1];
  }
  d->_l_MMXReg[1] = local_30;
  return;
}

Assistant:

void glue(helper_palignr, SUFFIX)(CPUX86State *env, Reg *d, Reg *s,
                                  int32_t shift)
{
    Reg r;

    /* XXX could be checked during translation */
    if (shift >= (16 << SHIFT)) {
        r.Q(0) = 0;
        XMM_ONLY(r.Q(1) = 0);
    } else {
        shift <<= 3;
#define SHR(v, i) (i < 64 && i > -64 ? i > 0 ? v >> (i) : (v << -(i)) : 0)
#if SHIFT == 0
        r.Q(0) = SHR(s->Q(0), shift - 0) |
            SHR(d->Q(0), shift -  64);
#else
        r.Q(0) = SHR(s->Q(0), shift - 0) |
            SHR(s->Q(1), shift -  64) |
            SHR(d->Q(0), shift - 128) |
            SHR(d->Q(1), shift - 192);
        r.Q(1) = SHR(s->Q(0), shift + 64) |
            SHR(s->Q(1), shift -   0) |
            SHR(d->Q(0), shift -  64) |
            SHR(d->Q(1), shift - 128);
#endif
#undef SHR
    }

    *d = r;
}